

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O3

bool __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this,uint64_t *node_id,uint64_t symb)

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong v;
  ulong uVar7;
  ulong uVar8;
  
  v = *node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb;
  uVar5 = (v >> 0x1e ^ v) * -0x40a7b892e31b1a47;
  uVar5 = (uVar5 >> 0x1b ^ uVar5) * -0x6b2fb644ecceee15;
  uVar5 = uVar5 >> 0x1f ^ uVar5;
  uVar1 = (this->table_).width_;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    uVar5 = uVar5 & (this->capa_size_).mask_;
    if (1 < uVar5) {
      uVar6 = uVar1 * uVar5;
      uVar8 = (ulong)((uint)uVar6 & 0x3f);
      uVar7 = puVar2[uVar6 >> 6];
      if (uVar8 + uVar1 < 0x41) {
        uVar7 = uVar7 >> uVar8;
      }
      else {
        bVar3 = (byte)uVar6 & 0x3f;
        uVar7 = uVar7 >> bVar3 | puVar2[(uVar6 >> 6) + 1] << 0x40 - bVar3;
      }
      uVar7 = uVar7 & (this->table_).mask_;
      if (uVar7 == 0) {
        if (this->size_ == this->max_size_) {
          return false;
        }
        compact_vector::set(&this->table_,uVar5,v);
        this->size_ = this->size_ + 1;
        bVar4 = true;
        goto LAB_0010440a;
      }
      if (uVar7 == v) {
        bVar4 = false;
LAB_0010440a:
        *node_id = uVar5;
        return bVar4;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool add_child(uint64_t& node_id, uint64_t symb) {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        uint64_t key = make_key_(node_id, symb);
        assert(key != 0);

        for (uint64_t i = Hasher::hash(key) & capa_size_.mask();; i = right_(i)) {
            if (i == 0) {
                // table_[0] is always empty so that any table_[i] = 0 indicates to be empty.
                continue;
            }

            if (i == get_root()) {
                continue;
            }

            if (table_[i] == 0) {
                // this slot is empty
                if (size_ == max_size_) {
                    return false;  // needs to expand
                }

                table_.set(i, key);

                ++size_;
                node_id = i;

                return true;
            }

            if (table_[i] == key) {
                node_id = i;
                return false;  // already stored
            }
        }
    }